

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

void __thiscall
cs::translator_type::translate
          (translator_type *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *lines,deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *statements,
          bool raw)

{
  method_base *pmVar1;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_00;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_01;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_02;
  initializer_list<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> __l_03;
  bool bVar2;
  int iVar3;
  reference pptVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar5;
  undefined4 extraout_var_01;
  method_base **ppmVar6;
  string *str;
  undefined8 in_RDX;
  undefined8 in_RSI;
  byte in_R8B;
  exception *e;
  exception *e_1;
  domain_type domain;
  method_base *expected_method;
  statement_base *sptr;
  method_base *m;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> line;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *it;
  const_iterator __end1;
  const_iterator __begin1;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *__range1;
  stack_type<cs::method_base_*,_std::allocator> methods;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  tmp;
  size_t line_num;
  size_t method_line_num;
  domain_manager *in_stack_fffffffffffff6e8;
  domain_manager *in_stack_fffffffffffff6f0;
  compile_error *this_00;
  undefined7 in_stack_fffffffffffff6f8;
  undefined1 in_stack_fffffffffffff6ff;
  compiler_type *in_stack_fffffffffffff700;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffff710;
  allocator_type *in_stack_fffffffffffff718;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffff720;
  iterator in_stack_fffffffffffff728;
  stack_type<cs::method_base_*,_std::allocator> *in_stack_fffffffffffff730;
  method_base **in_stack_fffffffffffff738;
  stack_type<cs::method_base_*,_std::allocator> *in_stack_fffffffffffff740;
  undefined1 ***local_890;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffff7a8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffff7b0;
  undefined1 ***local_838;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffff808;
  translator_type *in_stack_fffffffffffff810;
  undefined1 ***local_7d0;
  undefined1 ***local_770;
  undefined1 ***local_708;
  undefined1 local_681 [161];
  undefined8 **local_5e0;
  undefined1 **local_5d8 [10];
  undefined8 **local_588;
  undefined8 local_580;
  undefined1 local_578 [88];
  undefined8 **local_520;
  undefined1 **local_518 [10];
  undefined8 **local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8 [88];
  undefined8 **local_460;
  undefined1 **local_458 [10];
  undefined8 **local_408;
  undefined8 local_400;
  undefined1 local_3f8 [88];
  undefined8 **local_3a0;
  undefined1 **local_398 [10];
  undefined8 **local_348;
  undefined8 local_340;
  undefined1 local_338 [86];
  undefined1 local_2e2;
  allocator local_2e1;
  string local_2e0 [40];
  undefined8 **local_2b8;
  undefined1 **local_2b0 [10];
  undefined8 **local_260;
  undefined8 local_258;
  undefined1 local_250 [80];
  undefined1 local_200 [96];
  method_base *local_1a0;
  long local_198;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [32];
  method_base *local_168;
  undefined1 local_160 [80];
  reference local_110;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_e8;
  undefined8 local_c8;
  stack_type<cs::method_base_*,_std::allocator> local_b0;
  undefined1 local_88 [80];
  size_t local_38;
  size_t local_30;
  byte local_21;
  undefined8 local_18;
  undefined8 local_10;
  
  local_21 = in_R8B & 1;
  local_30 = 0;
  local_38 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)0x1d87c8);
  stack_type<cs::method_base_*,_std::allocator>::stack_type
            ((stack_type<cs::method_base_*,_std::allocator> *)in_stack_fffffffffffff700);
  local_c8 = local_18;
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffff6e8);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         *)in_stack_fffffffffffff6e8);
  do {
    bVar2 = std::operator!=((_Self *)in_stack_fffffffffffff6f0,(_Self *)in_stack_fffffffffffff6e8);
    if (!bVar2) {
      bVar2 = stack_type<cs::method_base_*,_std::allocator>::empty(&local_b0);
      if (bVar2) {
        stack_type<cs::method_base_*,_std::allocator>::~stack_type
                  ((stack_type<cs::method_base_*,_std::allocator> *)in_stack_fffffffffffff6f0);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)in_stack_fffffffffffff740);
        return;
      }
      str = (string *)__cxa_allocate_exception(0x28);
      this_00 = (compile_error *)local_681;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_681 + 1),"Lack of the \"end\" signal.",(allocator *)this_00);
      compile_error::compile_error(this_00,str);
      __cxa_throw(str,&compile_error::typeinfo,compile_error::~compile_error);
    }
    local_110 = std::
                _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
                ::operator*(&local_e8);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         in_stack_fffffffffffff700);
    local_38 = token_base::get_line_num(*pptVar4);
    if ((local_21 & 1) != 0) {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x1d888f);
      std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x1d8897);
      compiler_type::process_line
                (in_stack_fffffffffffff700,
                 (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                 CONCAT17(in_stack_fffffffffffff6ff,in_stack_fffffffffffff6f8));
    }
    local_168 = match(in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    iVar3 = (*local_168->_vptr_method_base[2])();
    uVar5 = local_10;
    pmVar1 = local_168;
    switch(iVar3) {
    case 0:
      local_18a = 1;
      uVar5 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_188,"Null type of grammar.",&local_189);
      compile_error::compile_error
                ((compile_error *)in_stack_fffffffffffff6f0,(string *)in_stack_fffffffffffff6e8);
      local_18a = 0;
      __cxa_throw(uVar5,&compile_error::typeinfo,compile_error::~compile_error);
    case 1:
      local_198 = 0;
      bVar2 = stack_type<cs::method_base_*,_std::allocator>::empty(&local_b0);
      if (bVar2) {
        iVar3 = (*local_168->_vptr_method_base[3])();
        uVar5 = local_10;
        pmVar1 = local_168;
        if (iVar3 == 0x19) {
          local_2e2 = 1;
          uVar5 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2e0,"Hanging end statement.",&local_2e1);
          compile_error::compile_error
                    ((compile_error *)in_stack_fffffffffffff6f0,(string *)in_stack_fffffffffffff6e8)
          ;
          local_2e2 = 0;
          __cxa_throw(uVar5,&compile_error::typeinfo,compile_error::~compile_error);
        }
        if ((local_21 & 1) != 0) {
          local_3a0 = local_398;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                    (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
          local_348 = local_398;
          local_340 = 1;
          std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::
          allocator((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                    0x1d90b2);
          __l_00._M_len = (size_type)in_stack_fffffffffffff730;
          __l_00._M_array = in_stack_fffffffffffff728;
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::deque(in_stack_fffffffffffff720,__l_00,in_stack_fffffffffffff718);
          (*pmVar1->_vptr_method_base[4])(pmVar1,uVar5,local_338);
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                    *)in_stack_fffffffffffff740);
          std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::
          ~allocator((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                     0x1d9116);
          local_770 = (undefined1 ***)&local_348;
          do {
            local_770 = local_770 + -10;
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffff740);
          } while (local_770 != local_398);
        }
        uVar5 = local_10;
        pmVar1 = local_168;
        local_460 = local_458;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                  (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        local_408 = local_458;
        local_400 = 1;
        std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
                  ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                   0x1d92e4);
        __l_01._M_len = (size_type)in_stack_fffffffffffff730;
        __l_01._M_array = in_stack_fffffffffffff728;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque(in_stack_fffffffffffff720,__l_01,in_stack_fffffffffffff718);
        iVar3 = (*pmVar1->_vptr_method_base[5])(pmVar1,uVar5,local_3f8);
        local_198 = CONCAT44(extraout_var_01,iVar3);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)in_stack_fffffffffffff740);
        std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
                  ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                   0x1d9360);
        local_7d0 = (undefined1 ***)&local_408;
        do {
          local_7d0 = local_7d0 + -10;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffff740);
        } while (local_7d0 != local_458);
      }
      else {
        local_1a0 = (method_base *)0x0;
        iVar3 = (*local_168->_vptr_method_base[3])();
        if (iVar3 == 0x19) {
          if ((local_21 & 1) != 0) {
            std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d8abe);
            std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d8aca);
            domain_manager::remove_set((domain_manager *)0x1d8ad6);
            std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d8ae5);
            std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d8af1);
            domain_manager::get_domain(in_stack_fffffffffffff6e8);
            domain_type::domain_type
                      ((domain_type *)in_stack_fffffffffffff700,
                       (domain_type *)CONCAT17(in_stack_fffffffffffff6ff,in_stack_fffffffffffff6f8))
            ;
            std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d8b29);
            std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d8b35);
            domain_manager::remove_domain(in_stack_fffffffffffff6f0);
            ppmVar6 = stack_type<cs::method_base_*,_std::allocator>::top(in_stack_fffffffffffff730);
            (*(*ppmVar6)->_vptr_method_base[6])(*ppmVar6,local_10,local_200);
            domain_type::~domain_type((domain_type *)in_stack_fffffffffffff6f0);
          }
          ppmVar6 = stack_type<cs::method_base_*,_std::allocator>::top(in_stack_fffffffffffff730);
          local_1a0 = *ppmVar6;
          stack_type<cs::method_base_*,_std::allocator>::pop(in_stack_fffffffffffff740);
        }
        bVar2 = stack_type<cs::method_base_*,_std::allocator>::empty(&local_b0);
        uVar5 = local_10;
        pmVar1 = local_168;
        if (bVar2) {
          local_38 = local_30;
          iVar3 = (*local_168->_vptr_method_base[3])();
          if (iVar3 == 0x19) {
            iVar3 = (*local_168->_vptr_method_base[7])
                              (local_168,local_1a0,local_10,local_88,local_160);
            local_198 = CONCAT44(extraout_var,iVar3);
          }
          else {
            iVar3 = (*local_1a0->_vptr_method_base[5])(local_1a0,local_10,local_88);
            local_198 = CONCAT44(extraout_var_00,iVar3);
          }
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::clear(in_stack_fffffffffffff710);
        }
        else {
          if ((local_21 & 1) != 0) {
            local_2b8 = local_2b0;
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                      (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
            local_260 = local_2b0;
            local_258 = 1;
            std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::
            allocator((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *
                      )0x1d8d51);
            __l._M_len = (size_type)in_stack_fffffffffffff730;
            __l._M_array = in_stack_fffffffffffff728;
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::deque(in_stack_fffffffffffff720,__l,in_stack_fffffffffffff718);
            (*pmVar1->_vptr_method_base[4])(pmVar1,uVar5,local_250);
            std::
            deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                      *)in_stack_fffffffffffff740);
            std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::
            ~allocator((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>
                        *)0x1d8db5);
            local_708 = (undefined1 ***)&local_260;
            do {
              local_708 = local_708 + -10;
              std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                        ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                         in_stack_fffffffffffff740);
            } while (local_708 != local_2b0);
          }
          std::
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       *)in_stack_fffffffffffff6f0,(value_type *)in_stack_fffffffffffff6e8);
        }
      }
      if (local_198 != 0) {
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::push_back
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
                   in_stack_fffffffffffff6f0,(value_type *)in_stack_fffffffffffff6e8);
      }
      break;
    case 2:
      bVar2 = stack_type<cs::method_base_*,_std::allocator>::empty(&local_b0);
      if (bVar2) {
        pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
                            ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                             in_stack_fffffffffffff700);
        local_30 = token_base::get_line_num(*pptVar4);
      }
      stack_type<cs::method_base*,std::allocator>::push<cs::method_base*&>
                (in_stack_fffffffffffff740,in_stack_fffffffffffff738);
      if ((local_21 & 1) != 0) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1d955b);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1d9567);
        domain_manager::add_domain(in_stack_fffffffffffff6f0);
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1d9582);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1d958e);
        domain_manager::add_set((domain_manager *)0x1d959a);
        ppmVar6 = stack_type<cs::method_base_*,_std::allocator>::top(in_stack_fffffffffffff730);
        uVar5 = local_10;
        pmVar1 = *ppmVar6;
        local_520 = local_518;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                  (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
        local_4c8 = local_518;
        local_4c0 = 1;
        std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
                  ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                   0x1d9626);
        __l_02._M_len = (size_type)in_stack_fffffffffffff730;
        __l_02._M_array = in_stack_fffffffffffff728;
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::deque(in_stack_fffffffffffff720,__l_02,in_stack_fffffffffffff718);
        (*pmVar1->_vptr_method_base[4])(pmVar1,uVar5,local_4b8);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                  *)in_stack_fffffffffffff740);
        std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
                  ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                   0x1d968a);
        local_838 = (undefined1 ***)&local_4c8;
        do {
          local_838 = local_838 + -10;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffff740);
        } while (local_838 != local_518);
      }
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::push_back((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                   *)in_stack_fffffffffffff6f0,(value_type *)in_stack_fffffffffffff6e8);
      break;
    case 3:
      local_5e0 = local_5d8;
      std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
      local_588 = local_5d8;
      local_580 = 1;
      std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
                ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                 0x1d9874);
      __l_03._M_len = (size_type)in_stack_fffffffffffff730;
      __l_03._M_array = in_stack_fffffffffffff728;
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::deque(in_stack_fffffffffffff720,__l_03,in_stack_fffffffffffff718);
      (*pmVar1->_vptr_method_base[5])(pmVar1,uVar5,local_578);
      std::
      deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
      ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                *)in_stack_fffffffffffff740);
      std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
                ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)
                 0x1d98d8);
      local_890 = (undefined1 ***)&local_588;
      do {
        local_890 = local_890 + -10;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffff740);
      } while (local_890 != local_5d8);
    }
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
               in_stack_fffffffffffff740);
    std::
    _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
    ::operator++((_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
                  *)in_stack_fffffffffffff6f0);
  } while( true );
}

Assistant:

void translator_type::translate(const context_t &context, const std::deque<std::deque<token_base *>> &lines,
	                                std::deque<statement_base *> &statements, bool raw)
	{
		std::size_t method_line_num = 0, line_num = 0;
		std::deque<std::deque<token_base *>> tmp;
		stack_type<method_base *> methods;
		for (auto &it: lines) {
			std::deque<token_base *> line = it;
			line_num = static_cast<token_endline *>(line.back())->get_line_num();
			try {
				if (raw)
					context->compiler->process_line(line);
				method_base *m = this->match(line);
				switch (m->get_type()) {
				case method_types::null:
					throw compile_error("Null type of grammar.");
					break;
				case method_types::single: {
					statement_base *sptr = nullptr;
					if (!methods.empty()) {
						method_base *expected_method = nullptr;
						if (m->get_target_type() == statement_types::end_) {
							if (raw) {
								context->instance->storage.remove_set();
								domain_type domain = std::move(context->instance->storage.get_domain());
								context->instance->storage.remove_domain();
								methods.top()->postprocess(context, domain);
							}
							expected_method = methods.top();
							methods.pop();
						}
						if (methods.empty()) {
							line_num = method_line_num;
							if (m->get_target_type() == statement_types::end_)
								sptr = static_cast<method_end *>(m)->translate_end(expected_method, context, tmp,
								        line);
							else
								sptr = expected_method->translate(context, tmp);
							tmp.clear();
						}
						else {
							if (raw)
								m->preprocess(context, {line});
							tmp.push_back(line);
						}
					}
					else {
						if (m->get_target_type() == statement_types::end_)
							throw compile_error("Hanging end statement.");
						else {
							if (raw)
								m->preprocess(context, {line});
							sptr = m->translate(context, {line});
						}
					}
					if (sptr != nullptr)
						statements.push_back(sptr);
				}
				break;
				case method_types::block: {
					if (methods.empty())
						method_line_num = static_cast<token_endline *>(line.back())->get_line_num();
					methods.push(m);
					if (raw) {
						context->instance->storage.add_domain();
						context->instance->storage.add_set();
						methods.top()->preprocess(context, {line});
					}
					tmp.push_back(line);
				}
				break;
				case method_types::jit_command:
					m->translate(context, {line});
					break;
				}
			}
			catch (const cs::exception &e) {
				throw e;
			}
			catch (const std::exception &e) {
				throw exception(line_num, context->file_path, context->file_buff.at(line_num - 1), e.what());
			}
		}
		if (!methods.empty())
			throw compile_error("Lack of the \"end\" signal.");
	}